

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::NullLength::Run(NullLength *this)

{
  bool bVar1;
  GLuint program_00;
  char *src_vs;
  char *src_fs;
  undefined8 uVar2;
  CallLogWrapper *this_00;
  allocator<char> local_4a9;
  undefined1 local_4a8 [8];
  string expected;
  GLenum local_480;
  GLint res;
  GLenum prop;
  GLuint index;
  GLchar name [1024];
  string local_60 [32];
  string local_40 [36];
  GLuint local_1c;
  NullLength *pNStack_18;
  GLuint program;
  NullLength *this_local;
  
  pNStack_18 = this;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(local_60);
  src_fs = (char *)std::__cxx11::string::c_str();
  program_00 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_1c = program_00;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program_00,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,local_1c);
  memset(&prop,0,0x400);
  res = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,local_1c,0x92e4,"color");
  local_480 = 0x92fb;
  glu::CallLogWrapper::glGetProgramResourceName
            (this_00,local_1c,0x92e4,0,0x400,(GLsizei *)0x0,(GLchar *)&prop);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,local_1c,0x92e4,res,1,&stack0xfffffffffffffb80,1,(GLsizei *)0x0,
             (GLint *)(expected.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4a8,"color",&local_4a9);
  std::allocator<char>::~allocator(&local_4a9);
  bVar1 = std::operator!=((char *)&prop,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4a8);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    anon_unknown_0::Output("Expected name: %s, got: %s\n",uVar2,&prop);
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_1c);
    this_local = (NullLength *)&DAT_ffffffffffffffff;
  }
  else if (expected.field_2._12_4_ == 1) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_1c);
    this_local = (NullLength *)0x0;
  }
  else {
    anon_unknown_0::Output("Expected array_size: 1, got: %d\n",(ulong)(uint)expected.field_2._12_4_)
    ;
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,local_1c);
    this_local = (NullLength *)&DAT_ffffffffffffffff;
  }
  std::__cxx11::string::~string((string *)local_4a8);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		GLchar name[1024] = { '\0' };
		GLuint index	  = glGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color");
		GLenum prop		  = GL_ARRAY_SIZE;
		GLint  res;
		glGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, 1024, NULL, name);
		glGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, index, 1, &prop, 1, NULL, &res);

		std::string expected = "color";
		if (name != expected)
		{
			Output("Expected name: %s, got: %s\n", expected.c_str(), name);
			glDeleteProgram(program);
			return ERROR;
		}
		else if (res != 1)
		{
			Output("Expected array_size: 1, got: %d\n", res);
			glDeleteProgram(program);
			return ERROR;
		}

		glDeleteProgram(program);
		return NO_ERROR;
	}